

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_semantic_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t location,ExecutionModel em,
          StorageClass sc)

{
  HLSLVertexAttributeRemap *pHVar1;
  undefined4 in_register_0000000c;
  HLSLVertexAttributeRemap *attribute;
  HLSLVertexAttributeRemap *__end2;
  HLSLVertexAttributeRemap *__begin2;
  SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *__range2;
  StorageClass sc_local;
  ExecutionModel em_local;
  uint32_t location_local;
  CompilerHLSL *this_local;
  
  sc_local = location;
  _em_local = this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  if ((em == ExecutionModelVertex) && (sc == Input)) {
    __end2 = VectorView<spirv_cross::HLSLVertexAttributeRemap>::begin
                       (&(this->remap_vertex_attributes).
                         super_VectorView<spirv_cross::HLSLVertexAttributeRemap>);
    pHVar1 = VectorView<spirv_cross::HLSLVertexAttributeRemap>::end
                       (&(this->remap_vertex_attributes).
                         super_VectorView<spirv_cross::HLSLVertexAttributeRemap>);
    for (; __end2 != pHVar1; __end2 = __end2 + 1) {
      if (__end2->location == sc_local) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&__end2->semantic)
        ;
        return __return_storage_ptr__;
      }
    }
  }
  join<char_const(&)[9],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)"TEXCOORD",(char (*) [9])&sc_local,
             (uint *)CONCAT44(in_register_0000000c,em));
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_semantic(uint32_t location, ExecutionModel em, StorageClass sc)
{
	if (em == ExecutionModelVertex && sc == StorageClassInput)
	{
		// We have a vertex attribute - we should look at remapping it if the user provided
		// vertex attribute hints.
		for (auto &attribute : remap_vertex_attributes)
			if (attribute.location == location)
				return attribute.semantic;
	}

	// Not a vertex attribute, or no remap_vertex_attributes entry.
	return join("TEXCOORD", location);
}